

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall QtMWidgets::MessageBox::removeButton(MessageBox *this,QAbstractButton *button)

{
  long lVar1;
  QAbstractButton **ppQVar2;
  MessageBoxPrivate *pMVar3;
  QHBoxLayout *pQVar4;
  bool bVar5;
  long *plVar6;
  long *plVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  QAbstractButton *local_40;
  undefined8 local_38;
  
  pMVar3 = (this->d).d;
  if ((pMVar3->okButton != (MsgBoxButton *)button) &&
     (local_40 = button,
     bVar5 = QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::contains
                       (&pMVar3->buttonsMap,&local_40), bVar5)) {
    pMVar3 = (this->d).d;
    lVar8 = (pMVar3->buttons).d.size;
    if (0 < lVar8) {
      lVar8 = lVar8 << 3;
      lVar11 = 0;
      iVar9 = 0;
      lVar10 = 0;
      do {
        if (lVar8 == 0) {
          return;
        }
        iVar9 = iVar9 + -2;
        lVar1 = lVar10 + 1;
        lVar11 = lVar11 + -0x100000000;
        lVar8 = lVar8 + -8;
        ppQVar2 = (pMVar3->buttons).d.ptr + lVar10;
        lVar10 = lVar1;
      } while (*ppQVar2 != local_40);
      if ((int)lVar1 != 0) {
        plVar6 = (long *)(**(code **)(*(long *)pMVar3->hbox + 0xb0))(pMVar3->hbox,-2 - iVar9);
        pQVar4 = ((this->d).d)->hbox;
        plVar7 = (long *)(**(code **)(*(long *)pQVar4 + 0xb0))(pQVar4,-3 - iVar9);
        lVar8 = (**(code **)(*plVar7 + 0x68))(plVar7);
        if (lVar8 != 0) {
          (**(code **)(*plVar7 + 0x68))(plVar7);
          QObject::deleteLater();
        }
        if (plVar6 != (long *)0x0) {
          (**(code **)(*plVar6 + 8))(plVar6);
        }
        (**(code **)(*plVar7 + 8))(plVar7);
        QList<QAbstractButton_*>::removeAt(&((this->d).d)->buttons,-0x100000000 - lVar11 >> 0x20);
        QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::remove
                  (&((this->d).d)->buttonsMap,(char *)&local_40);
        QList<QFrame_*>::removeAt(&((this->d).d)->buttonSeparators,-0x200000000 - lVar11 >> 0x20);
        QObject::disconnect((QObject *)local_40,(char *)0x0,(QObject *)this,(char *)0x0);
        QObject::deleteLater();
        local_38 = (**(code **)(*(long *)((this->d).d)->vbox + 0xf0))();
        QWidget::resize((QSize *)this);
        MessageBoxPrivate::adjustSize((this->d).d);
      }
    }
  }
  return;
}

Assistant:

void
MessageBox::removeButton( QAbstractButton * button )
{
	if( d->okButton != button && d->buttonsMap.contains( button ) )
	{
		const int index = d->buttons.indexOf( button );

		if( index != -1 )
		{
			QLayoutItem * b = d->hbox->takeAt( index * 2 );
			QLayoutItem * l = d->hbox->takeAt( index * 2 - 1 );

			if( l->widget() )
				l->widget()->deleteLater();

			delete b;
			delete l;

			d->buttons.removeAt( index );
			d->buttonsMap.remove( button );
			d->buttonSeparators.removeAt( index - 1 );

			disconnect( button, 0, this, 0 );

			button->deleteLater();

			resize( d->vbox->sizeHint() );

			d->adjustSize();
		}
	}
}